

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_value_init_object(void)

{
  JSON_Object *pJVar1;
  JSON_Value *new_value;
  
  new_value = (JSON_Value *)(*parson_malloc)(0x20);
  if (new_value == (JSON_Value *)0x0) {
    new_value = (JSON_Value *)0x0;
  }
  else {
    new_value->parent = (JSON_Value *)0x0;
    new_value->type = 4;
    pJVar1 = json_object_make(new_value);
    (new_value->value).object = pJVar1;
    if ((new_value->value).string.chars == (char *)0x0) {
      (*parson_free)(new_value);
      new_value = (JSON_Value *)0x0;
    }
  }
  return new_value;
}

Assistant:

JSON_Value * json_value_init_object(void) {
    JSON_Value *new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (!new_value) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONObject;
    new_value->value.object = json_object_make(new_value);
    if (!new_value->value.object) {
        parson_free(new_value);
        return NULL;
    }
    return new_value;
}